

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmp4stream.cpp
# Opt level: O2

void __thiscall fmp4_stream::sc35_splice_info::print(sc35_splice_info *this,bool verbose)

{
  long lVar1;
  ostream *poVar2;
  undefined7 in_register_00000031;
  char *pcVar3;
  
  lVar1 = std::cout;
  if ((int)CONCAT71(in_register_00000031,verbose) != 0) {
    *(undefined8 *)(std::__cxx11::stringstream::stringstream + *(long *)(std::cout + -0x18)) = 0x21;
    *(uint *)(isalnum + *(long *)(lVar1 + -0x18)) =
         *(uint *)(isalnum + *(long *)(lVar1 + -0x18)) & 0xffffff4f | 0x20;
    poVar2 = std::operator<<((ostream *)&std::cout," table id: ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::endl<char,std::char_traits<char>>(poVar2);
    lVar1 = std::cout;
    *(undefined8 *)(std::__cxx11::stringstream::stringstream + *(long *)(std::cout + -0x18)) = 0x21;
    *(uint *)(isalnum + *(long *)(lVar1 + -0x18)) =
         *(uint *)(isalnum + *(long *)(lVar1 + -0x18)) & 0xffffff4f | 0x20;
    poVar2 = std::operator<<((ostream *)&std::cout," section_syntax_indicator: ");
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    std::endl<char,std::char_traits<char>>(poVar2);
    lVar1 = std::cout;
    *(undefined8 *)(std::__cxx11::stringstream::stringstream + *(long *)(std::cout + -0x18)) = 0x21;
    *(uint *)(isalnum + *(long *)(lVar1 + -0x18)) =
         *(uint *)(isalnum + *(long *)(lVar1 + -0x18)) & 0xffffff4f | 0x20;
    poVar2 = std::operator<<((ostream *)&std::cout," private_indicator: ");
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    std::endl<char,std::char_traits<char>>(poVar2);
    lVar1 = std::cout;
    *(undefined8 *)(std::__cxx11::stringstream::stringstream + *(long *)(std::cout + -0x18)) = 0x21;
    *(uint *)(isalnum + *(long *)(lVar1 + -0x18)) =
         *(uint *)(isalnum + *(long *)(lVar1 + -0x18)) & 0xffffff4f | 0x20;
    poVar2 = std::operator<<((ostream *)&std::cout," section_length: ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::endl<char,std::char_traits<char>>(poVar2);
    lVar1 = std::cout;
    *(undefined8 *)(std::__cxx11::stringstream::stringstream + *(long *)(std::cout + -0x18)) = 0x21;
    *(uint *)(isalnum + *(long *)(lVar1 + -0x18)) =
         *(uint *)(isalnum + *(long *)(lVar1 + -0x18)) & 0xffffff4f | 0x20;
    poVar2 = std::operator<<((ostream *)&std::cout," protocol_version: ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::endl<char,std::char_traits<char>>(poVar2);
    lVar1 = std::cout;
    *(undefined8 *)(std::__cxx11::stringstream::stringstream + *(long *)(std::cout + -0x18)) = 0x21;
    *(uint *)(isalnum + *(long *)(lVar1 + -0x18)) =
         *(uint *)(isalnum + *(long *)(lVar1 + -0x18)) & 0xffffff4f | 0x20;
    poVar2 = std::operator<<((ostream *)&std::cout," encrypted_packet: ");
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    std::endl<char,std::char_traits<char>>(poVar2);
    lVar1 = std::cout;
    *(undefined8 *)(std::__cxx11::stringstream::stringstream + *(long *)(std::cout + -0x18)) = 0x21;
    *(uint *)(isalnum + *(long *)(lVar1 + -0x18)) =
         *(uint *)(isalnum + *(long *)(lVar1 + -0x18)) & 0xffffff4f | 0x20;
    poVar2 = std::operator<<((ostream *)&std::cout," encryption_algorithm: ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::endl<char,std::char_traits<char>>(poVar2);
    lVar1 = std::cout;
    *(undefined8 *)(std::__cxx11::stringstream::stringstream + *(long *)(std::cout + -0x18)) = 0x21;
    *(uint *)(isalnum + *(long *)(lVar1 + -0x18)) =
         *(uint *)(isalnum + *(long *)(lVar1 + -0x18)) & 0xffffff4f | 0x20;
    poVar2 = std::operator<<((ostream *)&std::cout," pts_adjustment: ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::endl<char,std::char_traits<char>>(poVar2);
    lVar1 = std::cout;
    *(undefined8 *)(std::__cxx11::stringstream::stringstream + *(long *)(std::cout + -0x18)) = 0x21;
    *(uint *)(isalnum + *(long *)(lVar1 + -0x18)) =
         *(uint *)(isalnum + *(long *)(lVar1 + -0x18)) & 0xffffff4f | 0x20;
    poVar2 = std::operator<<((ostream *)&std::cout," cw_index: ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::endl<char,std::char_traits<char>>(poVar2);
    lVar1 = std::cout;
    *(undefined8 *)(std::__cxx11::stringstream::stringstream + *(long *)(std::cout + -0x18)) = 0x21;
    *(uint *)(isalnum + *(long *)(lVar1 + -0x18)) =
         *(uint *)(isalnum + *(long *)(lVar1 + -0x18)) & 0xffffff4f | 0x20;
    poVar2 = std::operator<<((ostream *)&std::cout," tier: ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::endl<char,std::char_traits<char>>(poVar2);
    lVar1 = std::cout;
    *(undefined8 *)(std::__cxx11::stringstream::stringstream + *(long *)(std::cout + -0x18)) = 0x21;
    *(uint *)(isalnum + *(long *)(lVar1 + -0x18)) =
         *(uint *)(isalnum + *(long *)(lVar1 + -0x18)) & 0xffffff4f | 0x20;
    poVar2 = std::operator<<((ostream *)&std::cout," splice_command_length: ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::endl<char,std::char_traits<char>>(poVar2);
    lVar1 = std::cout;
    *(undefined8 *)(std::__cxx11::stringstream::stringstream + *(long *)(std::cout + -0x18)) = 0x21;
    *(uint *)(isalnum + *(long *)(lVar1 + -0x18)) =
         *(uint *)(isalnum + *(long *)(lVar1 + -0x18)) & 0xffffff4f | 0x20;
    poVar2 = std::operator<<((ostream *)&std::cout," splice_command_type: ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::endl<char,std::char_traits<char>>(poVar2);
    lVar1 = std::cout;
    *(undefined8 *)(std::__cxx11::stringstream::stringstream + *(long *)(std::cout + -0x18)) = 0x21;
    *(uint *)(isalnum + *(long *)(lVar1 + -0x18)) =
         *(uint *)(isalnum + *(long *)(lVar1 + -0x18)) & 0xffffff4f | 0x20;
    poVar2 = std::operator<<((ostream *)&std::cout," descriptor_loop_length: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->descriptor_loop_length_);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  lVar1 = std::cout;
  *(undefined8 *)(std::__cxx11::stringstream::stringstream + *(long *)(std::cout + -0x18)) = 0x21;
  *(uint *)(isalnum + *(long *)(lVar1 + -0x18)) =
       *(uint *)(isalnum + *(long *)(lVar1 + -0x18)) & 0xffffff4f | 0x20;
  poVar2 = std::operator<<((ostream *)&std::cout," pts_adjustment: ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  lVar1 = std::cout;
  *(undefined8 *)(std::__cxx11::stringstream::stringstream + *(long *)(std::cout + -0x18)) = 0x21;
  *(uint *)(isalnum + *(long *)(lVar1 + -0x18)) =
       *(uint *)(isalnum + *(long *)(lVar1 + -0x18)) & 0xffffff4f | 0x20;
  std::operator<<((ostream *)&std::cout," Command type: ");
  lVar1 = std::cout;
  switch(this->splice_command_type_) {
  case '\0':
    std::ostream::operator<<(&std::cout,0);
    lVar1 = std::cout;
    *(undefined8 *)(std::__cxx11::stringstream::stringstream + *(long *)(std::cout + -0x18)) = 0x21;
    *(uint *)(isalnum + *(long *)(lVar1 + -0x18)) =
         *(uint *)(isalnum + *(long *)(lVar1 + -0x18)) & 0xffffff4f | 0x20;
    pcVar3 = " splice null ";
    break;
  default:
    return;
  case '\x04':
    *(undefined8 *)(std::__cxx11::stringstream::stringstream + *(long *)(std::cout + -0x18)) = 0x21;
    *(uint *)(isalnum + *(long *)(lVar1 + -0x18)) =
         *(uint *)(isalnum + *(long *)(lVar1 + -0x18)) & 0xffffff4f | 0x20;
    pcVar3 = " splice schedule ";
    break;
  case '\x05':
    *(undefined8 *)(std::__cxx11::stringstream::stringstream + *(long *)(std::cout + -0x18)) = 0x21;
    *(uint *)(isalnum + *(long *)(lVar1 + -0x18)) =
         *(uint *)(isalnum + *(long *)(lVar1 + -0x18)) & 0xffffff4f | 0x20;
    poVar2 = std::operator<<((ostream *)&std::cout," splice insert ");
    std::endl<char,std::char_traits<char>>(poVar2);
    lVar1 = std::cout;
    *(undefined8 *)(std::__cxx11::stringstream::stringstream + *(long *)(std::cout + -0x18)) = 0x21;
    *(uint *)(isalnum + *(long *)(lVar1 + -0x18)) =
         *(uint *)(isalnum + *(long *)(lVar1 + -0x18)) & 0xffffff4f | 0x20;
    poVar2 = std::operator<<((ostream *)&std::cout," event_id: ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::endl<char,std::char_traits<char>>(poVar2);
    lVar1 = std::cout;
    *(undefined8 *)(std::__cxx11::stringstream::stringstream + *(long *)(std::cout + -0x18)) = 0x21;
    *(uint *)(isalnum + *(long *)(lVar1 + -0x18)) =
         *(uint *)(isalnum + *(long *)(lVar1 + -0x18)) & 0xffffff4f | 0x20;
    poVar2 = std::operator<<((ostream *)&std::cout," cancel indicator: ");
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    goto LAB_0010a1a2;
  case '\x06':
    *(undefined8 *)(std::__cxx11::stringstream::stringstream + *(long *)(std::cout + -0x18)) = 0x21;
    *(uint *)(isalnum + *(long *)(lVar1 + -0x18)) =
         *(uint *)(isalnum + *(long *)(lVar1 + -0x18)) & 0xffffff4f | 0x20;
    pcVar3 = "time signal ";
    break;
  case '\a':
    *(undefined8 *)(std::__cxx11::stringstream::stringstream + *(long *)(std::cout + -0x18)) = 0x21;
    *(uint *)(isalnum + *(long *)(lVar1 + -0x18)) =
         *(uint *)(isalnum + *(long *)(lVar1 + -0x18)) & 0xffffff4f | 0x20;
    pcVar3 = "bandwidth reservation ";
  }
  poVar2 = std::operator<<((ostream *)&std::cout,pcVar3);
LAB_0010a1a2:
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

void sc35_splice_info::print(bool verbose) const
	{
		if (verbose) {
			std::cout << std::setw(33) << std::left << " table id: " << (unsigned int)table_id_ << std::endl;
			std::cout << std::setw(33) << std::left << " section_syntax_indicator: " << section_syntax_indicator_ << std::endl;
			std::cout << std::setw(33) << std::left << " private_indicator: " << private_indicator_ << std::endl;
			std::cout << std::setw(33) << std::left << " section_length: " << (unsigned int)section_length_ << std::endl;
			std::cout << std::setw(33) << std::left << " protocol_version: " << (unsigned int)protocol_version_ << std::endl;
			std::cout << std::setw(33) << std::left << " encrypted_packet: " << encrypted_packet_ << std::endl;
			std::cout << std::setw(33) << std::left << " encryption_algorithm: " << (unsigned int)encryption_algorithm_ << std::endl;
			std::cout << std::setw(33) << std::left << " pts_adjustment: " << pts_adjustment_ << std::endl;
			std::cout << std::setw(33) << std::left << " cw_index: " << (unsigned int)cw_index_ << std::endl;
			std::cout << std::setw(33) << std::left << " tier: " << tier_ << std::endl;
			std::cout << std::setw(33) << std::left << " splice_command_length: " << splice_command_length_ << std::endl;
			std::cout << std::setw(33) << std::left << " splice_command_type: " << (unsigned int)splice_command_type_ << std::endl;
			std::cout << std::setw(33) << std::left << " descriptor_loop_length: " << descriptor_loop_length_ << std::endl;
		}
		std::cout << std::setw(33) << std::left << " pts_adjustment: " << pts_adjustment_ << std::endl;
		std::cout << std::setw(33) << std::left << " Command type: ";

		switch (splice_command_type_)
		{
		case 0x00: std::cout << 0x00; // prints "1"
			std::cout << std::setw(33) << std::left << " splice null " << std::endl;
			break;       // and exits the switch
		case 0x04:
			std::cout << std::setw(33) << std::left << " splice schedule " << std::endl;
			break;
		case 0x05:
			std::cout << std::setw(33) << std::left << " splice insert " << std::endl;
			std::cout << std::setw(33) << std::left << " event_id: " << splice_insert_event_id_ << std::endl;
			std::cout << std::setw(33) << std::left << " cancel indicator: " << splice_event_cancel_indicator_ << std::endl;
			break;
		case 0x06:
			std::cout << std::setw(33) << std::left << "time signal " << std::endl;
			break;
		case 0x07:
			std::cout << std::setw(33) << std::left << "bandwidth reservation " << std::endl;
			break;
		}
	}